

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLParsingTools.hpp
# Opt level: O2

string * __thiscall
Diligent::Parsing::
ExtractGLSLImageFormatFromComment<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End)

{
  char cVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_20 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,Start,(char *)0x0);
  if ((((local_20._M_current != Start->_M_current) && (*local_20._M_current == '/')) &&
      (local_20._M_current + 1 != Start->_M_current)) &&
     ((cVar1 = local_20._M_current[1], cVar1 == '*' || (cVar1 == '/')))) {
    local_20._M_current = local_20._M_current + 2;
    local_20 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (&local_20,Start,(char *)0x0);
    if (((local_20._M_current != Start->_M_current) &&
        ((bVar2 = SkipString<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (&local_20,Start,"format",&local_20), bVar2 &&
         (local_20 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (&local_20,Start,(char *)0x0),
         local_20._M_current != Start->_M_current)))) && (*local_20._M_current == '=')) {
      local_20._M_current = local_20._M_current + 1;
      local_20 = SkipDelimiters<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (&local_20,Start,(char *)0x0);
      if (local_20._M_current != Start->_M_current) {
        _Var3 = SkipIdentifier<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (&local_20,Start);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)__return_storage_ptr__,local_20._M_current,_Var3._M_current);
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ExtractGLSLImageFormatFromComment(const InteratorType& Start, const InteratorType& End)
{
    //    /* format = r32f */
    // ^
    auto Pos = SkipDelimiters(Start, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //    ^
    if (*Pos != '/')
        return {};

    ++Pos;
    //    /* format = r32f */
    //     ^
    //    // format = r32f
    //     ^
    if (Pos == End || (*Pos != '/' && *Pos != '*'))
        return {};

    ++Pos;
    //    /* format = r32f */
    //      ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //       ^
    if (!SkipString(Pos, End, "format", Pos))
        return {};

    //    /* format = r32f */
    //             ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //              ^
    if (*Pos != '=')
        return {};

    ++Pos;
    //    /* format = r32f */
    //               ^
    Pos = SkipDelimiters(Pos, End);
    if (Pos == End)
        return {};

    //    /* format = r32f */
    //                ^

    auto ImgFmtEndPos = SkipIdentifier(Pos, End);
    return {Pos, ImgFmtEndPos};
}